

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmSourceFileSetProperty(void *arg,char *prop,char *value)

{
  cmSourceFile *this;
  size_t sVar1;
  char *value_00;
  allocator local_41;
  string local_40;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    if (prop == (char *)0x0) {
      return;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(prop);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,prop,prop + sVar1);
    value_00 = "NOTFOUND";
    if (value != (char *)0x0) {
      value_00 = value;
    }
    cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_40,value_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_40,prop,&local_41);
    cmSourceFile::SetProperty(this,&local_40,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void CCONV cmSourceFileSetProperty(void *arg,const char *prop,
                                   const char *value)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if(cmSourceFile* rsf = sf->RealSourceFile)
    {
    rsf->SetProperty(prop, value);
    }
  else if(prop)
    {
    if(!value) { value = "NOTFOUND"; }
    sf->Properties.SetProperty(prop, value);
    }
}